

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O3

void mi_page_queue_remove(mi_page_queue_t *queue,mi_page_t *page)

{
  long lVar1;
  uintptr_t uVar2;
  mi_page_t *pmVar3;
  mi_page_s *pmVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  mi_page_t *pmVar9;
  ulong uVar10;
  mi_page_queue_t *pmVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar2 = page->xheap;
  pmVar3 = page->next;
  pmVar4 = page->prev;
  if (pmVar4 != (mi_page_s *)0x0) {
    pmVar4->next = pmVar3;
  }
  if (pmVar3 != (mi_page_t *)0x0) {
    pmVar3->prev = pmVar4;
  }
  if (queue->last == page) {
    queue->last = page->prev;
  }
  if (queue->first == page) {
    queue->first = pmVar3;
    auVar7 = _DAT_004f65a0;
    auVar6 = _DAT_004ee620;
    uVar14 = queue->block_size;
    if (uVar14 < 0x401) {
      pmVar9 = &_mi_page_empty;
      if (pmVar3 != (mi_page_t *)0x0) {
        pmVar9 = pmVar3;
      }
      if (*(mi_page_t **)(uVar2 + 0xf8 + (uVar14 + 7 & 0xfffffffffffffff8)) != pmVar9) {
        uVar12 = uVar14 + 7 >> 3;
        if (uVar14 < 9) {
          uVar14 = 0;
        }
        else {
          if (uVar14 < 0x41) {
            uVar14 = (ulong)((int)uVar12 + 1U & 0x1e);
          }
          else {
            uVar14 = uVar12 - 1;
            uVar10 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            uVar14 = ((ulong)((uint)(uVar14 >> (0x3dU - (char)(uVar10 ^ 0x3f) & 0x3f)) & 3) +
                      ((uVar10 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
          }
          pmVar11 = queue + -1;
          do {
            uVar15 = pmVar11->block_size + 7;
            uVar10 = uVar15 >> 3;
            if (uVar15 < 0x48) {
              uVar8 = (ulong)((int)uVar10 + 1U & 0x1e);
              if (uVar15 < 0x10) {
                uVar8 = 1;
              }
            }
            else if (uVar15 < 0x10008) {
              uVar15 = uVar10 - 1;
              uVar8 = 0x3f;
              if (uVar15 != 0) {
                for (; uVar15 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar8 = ((ulong)((uint)(uVar15 >> (0x3dU - (char)(uVar8 ^ 0x3f) & 0x3f)) & 3) +
                       ((uVar8 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
            }
            else {
              uVar8 = 0x49;
            }
          } while ((uVar14 == uVar8) &&
                  (bVar5 = (mi_page_queue_t *)(uVar2 + 0x500) < pmVar11, pmVar11 = pmVar11 + -1,
                  bVar5));
          uVar14 = uVar10 + 1;
          if (uVar12 <= uVar10) {
            uVar14 = uVar12;
          }
          if (uVar12 < uVar14) goto LAB_0049fa85;
        }
        lVar13 = uVar12 - uVar14;
        auVar16._8_4_ = (int)lVar13;
        auVar16._0_8_ = lVar13;
        auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
        lVar1 = uVar2 + uVar14 * 8;
        uVar14 = 0;
        auVar16 = auVar16 ^ _DAT_004ee620;
        do {
          auVar17._8_4_ = (int)uVar14;
          auVar17._0_8_ = uVar14;
          auVar17._12_4_ = (int)(uVar14 >> 0x20);
          auVar17 = (auVar17 | auVar7) ^ auVar6;
          if ((bool)(~(auVar17._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar17._0_4_ ||
                      auVar16._4_4_ < auVar17._4_4_) & 1)) {
            *(mi_page_t **)(lVar1 + 0xf8 + uVar14 * 8) = pmVar9;
          }
          if ((auVar17._12_4_ != auVar16._12_4_ || auVar17._8_4_ <= auVar16._8_4_) &&
              auVar17._12_4_ <= auVar16._12_4_) {
            *(mi_page_t **)(lVar1 + 0x100 + uVar14 * 8) = pmVar9;
          }
          uVar14 = uVar14 + 2;
        } while ((lVar13 + 2U & 0xfffffffffffffffe) != uVar14);
      }
    }
  }
LAB_0049fa85:
  *(long *)(uVar2 + 0xc0) = *(long *)(uVar2 + 0xc0) + -1;
  page->next = (mi_page_s *)0x0;
  page->prev = (mi_page_s *)0x0;
  (page->flags).full_aligned = (page->flags).full_aligned & 0xfe;
  return;
}

Assistant:

static void mi_page_queue_remove(mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(queue, page));
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));
  mi_heap_t* heap = mi_page_heap(page);

  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == queue->last)  queue->last = page->prev;
  if (page == queue->first) {
    queue->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, queue));
    mi_heap_queue_first_update(heap,queue);
  }
  heap->page_count--;
  page->next = NULL;
  page->prev = NULL;
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), NULL);
  mi_page_set_in_full(page,false);
}